

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O1

curi_status
handle_query_item(char *key,size_t keyLen,char *value,size_t valueLen,curi_settings *settings,
                 void *userData)

{
  size_t outputCapacity;
  curi_status cVar1;
  char *output;
  size_t urlDecodedKeyLen;
  size_t local_38;
  
  cVar1 = curi_status_success;
  if ((keyLen != 0) &&
     ((((settings->query_item_null_callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 ||
        (settings->query_item_int_callback != (_func_int_void_ptr_char_ptr_size_t_long *)0x0)) ||
       (settings->query_item_double_callback != (_func_int_void_ptr_char_ptr_size_t_double *)0x0))
      || (cVar1 = curi_status_success,
         settings->query_item_str_callback !=
         (_func_int_void_ptr_char_ptr_size_t_char_ptr_size_t *)0x0)))) {
    if (settings->url_decode == 0) {
      cVar1 = handle_query_item_decodedKey(key,keyLen,value,valueLen,settings,userData);
      return cVar1;
    }
    outputCapacity = keyLen + 1;
    output = (char *)(*settings->allocate)(userData,outputCapacity);
    cVar1 = curi_url_decode(key,keyLen,output,outputCapacity,&local_38);
    if (cVar1 == curi_status_success) {
      cVar1 = handle_query_item_decodedKey(output,local_38,value,valueLen,settings,userData);
    }
    (*settings->deallocate)(userData,output,outputCapacity);
  }
  return cVar1;
}

Assistant:

static curi_status handle_query_item(const char* key, size_t keyLen, const char* value, size_t valueLen, const curi_settings* settings, void* userData)
{
    curi_status status = curi_status_success;
    if (keyLen > 0 && (settings->query_item_null_callback || settings->query_item_int_callback || settings->query_item_double_callback || settings->query_item_str_callback))
    {
        if (settings->url_decode == 0)
        {
            status = handle_query_item_decodedKey(key, keyLen, value, valueLen, settings, userData);
        }
        else
        {
            size_t keyAllocationSize = (keyLen+1) * sizeof(char);
            size_t urlDecodedKeyLen;
            char* urlDecodedKey = (char*)settings->allocate(userData, keyAllocationSize);

            status = curi_url_decode(key, keyLen, urlDecodedKey, keyLen+1, &urlDecodedKeyLen);

            if (status == curi_status_success)
                status = handle_query_item_decodedKey(urlDecodedKey, urlDecodedKeyLen, value, valueLen, settings, userData);

            settings->deallocate(userData, urlDecodedKey, keyAllocationSize);
        }
    }
    return status;
}